

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

ScratchBuffer * __thiscall
pbrt::ThreadLocal<pbrt::ScratchBuffer>::Get(ThreadLocal<pbrt::ScratchBuffer> *this)

{
  bool bVar1;
  id __y;
  size_t sVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  Entry *pEVar6;
  char *in_RDI;
  ScratchBuffer *threadLocal_1;
  ScratchBuffer newItem;
  ScratchBuffer *threadLocal;
  size_type vb;
  int va;
  int tries;
  int step;
  uint32_t hash;
  id tid;
  Entry *in_stack_fffffffffffffdc0;
  optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry> *in_stack_fffffffffffffdc8;
  function<pbrt::ScratchBuffer_()> *in_stack_fffffffffffffdd0;
  ScratchBuffer *in_stack_fffffffffffffdd8;
  char (*in_stack_fffffffffffffe10) [17];
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  char *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe2c;
  undefined8 in_stack_fffffffffffffe38;
  ScratchBuffer *pSVar7;
  char (*in_stack_fffffffffffffe48) [8];
  int *in_stack_fffffffffffffe50;
  char (*in_stack_fffffffffffffe58) [17];
  unsigned_long *in_stack_fffffffffffffe60;
  int local_80;
  int local_7c;
  uint local_74;
  
  __y = std::this_thread::get_id();
  sVar2 = std::hash<std::thread::id>::operator()
                    ((hash<std::thread::id> *)in_stack_fffffffffffffdc8,
                     &in_stack_fffffffffffffdc0->tid);
  sVar3 = std::
          vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
          ::size((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                  *)(in_RDI + 0x38));
  local_74 = (uint)((sVar2 & 0xffffffff) % sVar3);
  local_7c = 1;
  local_80 = 0;
  std::shared_mutex::lock_shared((shared_mutex *)0x84c2e4);
  while( true ) {
    local_80 = local_80 + 1;
    sVar3 = std::
            vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
            ::size((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                    *)(in_RDI + 0x38));
    if (sVar3 <= (ulong)(long)local_80) {
      LogFatal<char_const(&)[8],char_const(&)[17],char_const(&)[8],int&,char_const(&)[17],unsigned_long&>
                ((LogLevel)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_RDI,
                 in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20,
                 (char (*) [8])CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 in_stack_fffffffffffffe10,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
    }
    pvVar4 = std::
             vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
             ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                           *)(in_RDI + 0x38),(ulong)local_74);
    bVar1 = pstd::optional::operator_cast_to_bool((optional *)pvVar4);
    if (bVar1) {
      std::
      vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
      ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                    *)(in_RDI + 0x38),(ulong)local_74);
      pEVar6 = pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>::operator->
                         ((optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry> *)0x84c3c3);
      bVar1 = std::operator==((id)(pEVar6->tid)._M_thread,__y);
      if (bVar1) {
        std::
        vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
        ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                      *)(in_RDI + 0x38),(ulong)local_74);
        pEVar6 = pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>::operator->
                           ((optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry> *)0x84c418);
        std::shared_mutex::unlock_shared((shared_mutex *)0x84c42e);
        return &pEVar6->value;
      }
    }
    pvVar4 = std::
             vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
             ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                           *)(in_RDI + 0x38),(ulong)local_74);
    bVar1 = pstd::optional::operator_cast_to_bool((optional *)pvVar4);
    if (!bVar1) break;
    local_74 = local_7c + local_74;
    local_7c = local_7c + 1;
    sVar3 = std::
            vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
            ::size((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                    *)(in_RDI + 0x38));
    if (sVar3 <= local_74) {
      sVar3 = std::
              vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
              ::size((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                      *)(in_RDI + 0x38));
      local_74 = (uint)((ulong)local_74 % sVar3);
    }
  }
  std::shared_mutex::unlock_shared((shared_mutex *)0x84c474);
  std::shared_mutex::lock((shared_mutex *)0x84c47e);
  std::function<pbrt::ScratchBuffer_()>::operator()(in_stack_fffffffffffffdd0);
  pvVar4 = std::
           vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
           ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                         *)(in_RDI + 0x38),(ulong)local_74);
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)pvVar4);
  if (bVar1) {
    do {
      local_74 = local_7c + local_74;
      local_7c = local_7c + 1;
      uVar5 = (ulong)local_74;
      sVar3 = std::
              vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
              ::size((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                      *)(in_RDI + 0x38));
      if (sVar3 <= uVar5) {
        sVar3 = std::
                vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                ::size((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                        *)(in_RDI + 0x38));
        local_74 = (uint)((ulong)local_74 % sVar3);
      }
      pvVar4 = std::
               vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
               ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                             *)(in_RDI + 0x38),(ulong)local_74);
      bVar1 = pstd::optional::operator_cast_to_bool((optional *)pvVar4);
    } while (bVar1);
  }
  ScratchBuffer::ScratchBuffer
            ((ScratchBuffer *)in_stack_fffffffffffffdc8,(ScratchBuffer *)in_stack_fffffffffffffdc0);
  std::
  vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
  ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                *)(in_RDI + 0x38),(ulong)local_74);
  pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>::operator=
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  Entry::~Entry((Entry *)0x84c5ed);
  std::
  vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
  ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>_>_>
                *)(in_RDI + 0x38),(ulong)local_74);
  pEVar6 = pstd::optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry>::operator->
                     ((optional<pbrt::ThreadLocal<pbrt::ScratchBuffer>::Entry> *)0x84c60c);
  pSVar7 = &pEVar6->value;
  std::shared_mutex::unlock((shared_mutex *)0x84c62b);
  ScratchBuffer::~ScratchBuffer(in_stack_fffffffffffffdd8);
  return pSVar7;
}

Assistant:

inline T &ThreadLocal<T>::Get() {
    std::thread::id tid = std::this_thread::get_id();
    uint32_t hash = std::hash<std::thread::id>()(tid);
    hash %= hashTable.size();
    int step = 1;
    int tries = 0;

    mutex.lock_shared();
    while (true) {
        CHECK_LT(++tries, hashTable.size());  // full hash table

        if (hashTable[hash] && hashTable[hash]->tid == tid) {
            // Found it
            T &threadLocal = hashTable[hash]->value;
            mutex.unlock_shared();
            return threadLocal;
        } else if (!hashTable[hash]) {
            mutex.unlock_shared();

            // Get reader-writer lock before calling the callback so that the user
            // doesn't have to worry about writing a thread-safe callback.
            mutex.lock();
            T newItem = create();

            if (hashTable[hash]) {
                // someone else got there first--keep looking, but now
                // with a writer lock.
                while (true) {
                    hash += step;
                    ++step;
                    if (hash >= hashTable.size())
                        hash %= hashTable.size();

                    if (!hashTable[hash])
                        break;
                }
            }

            hashTable[hash] = Entry{tid, std::move(newItem)};
            T &threadLocal = hashTable[hash]->value;
            mutex.unlock();
            return threadLocal;
        }

        hash += step;
        ++step;
        if (hash >= hashTable.size())
            hash %= hashTable.size();
    }
}